

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfusionstyle_p_p.h
# Opt level: O1

QColor __thiscall QFusionStylePrivate::highlightedOutline(QFusionStylePrivate *this,QPalette *pal)

{
  undefined8 uVar1;
  QColor QVar2;
  int iVar3;
  int iVar4;
  long *plVar5;
  long in_FS_OFFSET;
  undefined1 auVar6 [16];
  undefined8 local_38;
  undefined4 local_30;
  undefined2 local_2c;
  undefined1 *local_28;
  undefined4 uStack_20;
  undefined2 uStack_1c;
  undefined2 uStack_1a;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_28 = &DAT_aaaaaaaaaaaaaaaa;
  uStack_20 = 0xaaaaaaaa;
  uStack_1c = 0xaaaa;
  uStack_1a = 0xaaaa;
  plVar5 = (long *)QPalette::brush((ColorGroup)pal,Dark);
  local_38 = *(undefined8 *)(*plVar5 + 8);
  uVar1 = *(undefined8 *)(*plVar5 + 0x10);
  local_30 = (undefined4)uVar1;
  local_2c = (undefined2)((ulong)uVar1 >> 0x20);
  auVar6 = QColor::darker((int)&local_38);
  local_28 = auVar6._0_8_;
  uStack_20 = auVar6._8_4_;
  uStack_1c = auVar6._12_2_;
  iVar3 = QColor::value();
  if (0xa0 < iVar3) {
    iVar3 = QColor::hue();
    iVar4 = QColor::saturation();
    QColor::setHsl((int)&local_28,iVar3,iVar4,0xa0);
  }
  QVar2.ct._4_4_ = uStack_20;
  QVar2._0_8_ = local_28;
  QVar2.ct.argb.pad = uStack_1c;
  QVar2._14_2_ = uStack_1a;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return QVar2;
  }
  __stack_chk_fail();
}

Assistant:

QColor highlightedOutline(const QPalette &pal) const {
        QColor highlightedOutline = highlight(pal).darker(125);
        if (highlightedOutline.value() > 160)
            highlightedOutline.setHsl(highlightedOutline.hue(), highlightedOutline.saturation(), 160);
        return highlightedOutline;
    }